

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O0

VectorXd __thiscall
ChebTools::ChebyshevExpansion::get_node_function_values(ChebyshevExpansion *this)

{
  Index IVar1;
  MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *this_00;
  Index extraout_RDX;
  Index extraout_RDX_00;
  Index IVar2;
  EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *in_RSI;
  VectorXd VVar3;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
  local_30;
  size_t local_20;
  size_t N;
  ChebyshevExpansion *this_local;
  
  this_local = this;
  IVar1 = Eigen::EigenBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>_>::size
                    ((EigenBase<Eigen::Array<double,__1,_1,_0,__1,_1>_> *)(in_RSI + 0x30));
  if (IVar1 < 1) {
    IVar1 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size(in_RSI);
    local_20 = IVar1 - 1;
    this_00 = (MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)
              UMatrixLibrary::get((UMatrixLibrary *)u_matrix_library,local_20);
    local_30 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                         (this_00,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_RSI);
    Eigen::Matrix<double,-1,1,0,-1,1>::
    Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
              ((Matrix<double,_1,1,0,_1,1> *)this,
               (EigenBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                *)&local_30);
    IVar2 = extraout_RDX_00;
  }
  else {
    Eigen::Matrix<double,-1,1,0,-1,1>::Matrix<Eigen::Array<double,_1,1,0,_1,1>>
              ((Matrix<double,_1,1,0,_1,1> *)this,
               (EigenBase<Eigen::Array<double,__1,_1,_0,__1,_1>_> *)(in_RSI + 0x30));
    IVar2 = extraout_RDX;
  }
  VVar3.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = IVar2;
  VVar3.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (VectorXd)VVar3.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

Eigen::VectorXd ChebyshevExpansion::get_node_function_values() const{
        if (m_nodal_value_cache.size() > 0) {
            return m_nodal_value_cache;
        }
        else {
            std::size_t N = m_c.size() - 1;
            return u_matrix_library.get(N) * m_c;
        }
    }